

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void build_func_cfg(gen_ctx_t gen_ctx)

{
  MIR_context_t ctx_00;
  MIR_func_t func_00;
  MIR_item_t_conflict func_item;
  VARR_MIR_op_t *varr;
  MIR_op_t obj;
  MIR_reg_t MVar1;
  int iVar2;
  size_t sVar3;
  MIR_insn_t_conflict insn_00;
  MIR_op_t *ops;
  bb_t_conflict src;
  MIR_insn_t_conflict *__base;
  MIR_insn_t pMVar4;
  in_edge_t_conflict peVar5;
  out_edge_t peVar6;
  bitmap_t pVVar7;
  MIR_reg_t local_22c;
  MIR_reg_t local_228;
  MIR_reg_t local_224;
  MIR_insn_t local_1d8;
  MIR_insn_t prev_label;
  MIR_lref_data_t lref;
  undefined8 uStack_1c0;
  anon_union_32_12_57d33f68_for_u aStack_1b8;
  MIR_var_t local_198;
  bb_t_conflict local_180;
  char *local_178;
  char *local_170;
  bb_t_conflict local_168;
  bb_t_conflict label_bb;
  bb_t_conflict exit_bb;
  bb_t_conflict entry_bb;
  bb_t_conflict prev_bb;
  bb_t_conflict bb2;
  bb_t_conflict bb;
  MIR_var_t mir_var;
  MIR_reg_t reg;
  MIR_op_t temp_op3;
  MIR_op_t temp_op2;
  MIR_op_t temp_op1;
  MIR_op_t *op;
  size_t nops;
  size_t j;
  size_t i;
  MIR_insn_t bo_insn;
  MIR_insn_t new_label;
  MIR_insn_t new_insn;
  MIR_insn_t use_insn;
  MIR_insn_t ret_insn;
  MIR_insn_t next_insn;
  MIR_insn_t insn2;
  MIR_insn_t insn;
  MIR_func_t func;
  MIR_context_t ctx;
  gen_ctx_t gen_ctx_local;
  
  ctx_00 = gen_ctx->ctx;
  func_00 = (gen_ctx->curr_func_item->u).func;
  DLIST_bb_t_init(&gen_ctx->curr_cfg->bbs);
  gen_ctx->curr_cfg->curr_bb_insn_index = 0;
  gen_ctx->curr_cfg->max_var = 0x21;
  gen_ctx->curr_cfg->root_loop_node = (loop_node_t_conflict)0x0;
  gen_ctx->curr_bb_index = 0;
  for (j = 0; sVar3 = VARR_MIR_var_tlength(func_00->vars), j < sVar3; j = j + 1) {
    VARR_MIR_var_tget((MIR_var_t *)&local_180,func_00->vars,j);
    bb = local_180;
    mir_var._0_8_ = local_178;
    mir_var.name = local_170;
    MVar1 = MIR_reg(ctx_00,local_178,func_00);
    update_max_var(gen_ctx,MVar1 + 0x21);
  }
  exit_bb = create_bb(gen_ctx,(MIR_insn_t)0x0);
  add_new_bb(gen_ctx,exit_bb);
  label_bb = create_bb(gen_ctx,(MIR_insn_t)0x0);
  add_new_bb(gen_ctx,label_bb);
  func_item = gen_ctx->curr_func_item;
  insn_00 = MIR_new_label(ctx_00);
  MIR_prepend_insn(ctx_00,func_item,insn_00);
  bb2 = create_bb(gen_ctx,(MIR_insn_t)0x0);
  add_new_bb(gen_ctx,bb2);
  bitmap_clear(gen_ctx->tied_regs);
  bitmap_clear(gen_ctx->addr_regs);
  gen_ctx->addr_insn_p = 0;
  VARR_MIR_insn_ttrunc(gen_ctx->temp_insns,0);
  VARR_MIR_insn_ttrunc(gen_ctx->temp_insns2,0);
  use_insn = (MIR_insn_t)0x0;
  insn2 = DLIST_MIR_insn_t_head(&func_00->insns);
  do {
    if (insn2 == (MIR_insn_t)0x0) {
      for (prev_label = (MIR_insn_t)func_00->first_lref; prev_label != (MIR_insn_t)0x0;
          prev_label = (MIR_insn_t)prev_label->ops[0].u.str.s) {
        VARR_MIR_insn_tpush(gen_ctx->temp_insns2,(prev_label->insn_link).prev);
        if ((prev_label->insn_link).next != (MIR_insn_t)0x0) {
          VARR_MIR_insn_tpush(gen_ctx->temp_insns2,(prev_label->insn_link).next);
        }
      }
      __base = VARR_MIR_insn_taddr(gen_ctx->temp_insns2);
      sVar3 = VARR_MIR_insn_tlength(gen_ctx->temp_insns2);
      qsort(__base,sVar3,8,label_cmp);
      j = 0;
      while( true ) {
        sVar3 = VARR_MIR_insn_tlength(gen_ctx->temp_insns);
        if (sVar3 <= j) {
          j = 0;
          while( true ) {
            sVar3 = VARR_MIR_insn_tlength(gen_ctx->temp_insns2);
            if (sVar3 <= j) {
              if (gen_ctx->optimize_level != 0) {
                remove_unreachable_bbs(gen_ctx);
              }
              for (bb2 = DLIST_bb_t_head(&gen_ctx->curr_cfg->bbs); bb2 != (bb_t_conflict)0x0;
                  bb2 = DLIST_bb_t_next(bb2)) {
                if ((bb2 != exit_bb) &&
                   (peVar5 = DLIST_in_edge_t_head(&bb2->in_edges), peVar5 == (in_edge_t_conflict)0x0
                   )) {
                  create_edge(gen_ctx,exit_bb,bb2,0,1);
                }
                if ((bb2 != label_bb) &&
                   (peVar6 = DLIST_out_edge_t_head(&bb2->out_edges), peVar6 == (out_edge_t)0x0)) {
                  create_edge(gen_ctx,bb2,label_bb,0,1);
                }
              }
              enumerate_bbs(gen_ctx);
              VARR_reg_info_tcreate(&gen_ctx->curr_cfg->reg_info,0x80);
              pVVar7 = bitmap_create2((ulong)gen_ctx->curr_cfg->max_var);
              gen_ctx->curr_cfg->call_crossed_regs = pVVar7;
              return;
            }
            pMVar4 = VARR_MIR_insn_tget(gen_ctx->temp_insns2,j);
            if ((int)*(undefined8 *)&pMVar4->field_0x18 != 0xb4) break;
            bb2 = get_insn_bb(gen_ctx,pMVar4);
            bb2->reachable_p = '\x01';
            j = j + 1;
          }
          __assert_fail("insn->code == MIR_LABEL",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x73b,"void build_func_cfg(gen_ctx_t)");
        }
        pMVar4 = VARR_MIR_insn_tget(gen_ctx->temp_insns,j);
        if ((int)*(undefined8 *)&pMVar4->field_0x18 != 0xa6) break;
        bb2 = get_insn_bb(gen_ctx,pMVar4);
        local_1d8 = (MIR_insn_t)0x0;
        for (nops = 0; sVar3 = VARR_MIR_insn_tlength(gen_ctx->temp_insns2), nops < sVar3;
            nops = nops + 1) {
          pMVar4 = VARR_MIR_insn_tget(gen_ctx->temp_insns2,nops);
          if (pMVar4 != local_1d8) {
            if ((int)*(undefined8 *)&pMVar4->field_0x18 != 0xb4) {
              __assert_fail("insn2->code == MIR_LABEL",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                            ,0x733,"void build_func_cfg(gen_ctx_t)");
            }
            prev_bb = get_insn_bb(gen_ctx,pMVar4);
            create_edge(gen_ctx,bb2,prev_bb,0,1);
            local_1d8 = pMVar4;
          }
        }
        j = j + 1;
      }
      __assert_fail("insn->code == MIR_JMPI",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x72d,"void build_func_cfg(gen_ctx_t)");
    }
    ret_insn = DLIST_MIR_insn_t_next(insn2);
    iVar2 = MIR_addr_code_p((MIR_insn_code_t)*(undefined8 *)&insn2->field_0x18);
    if (iVar2 == 0) {
      if ((int)*(undefined8 *)&insn2->field_0x18 != 0xab) {
        iVar2 = MIR_call_code_p((MIR_insn_code_t)*(undefined8 *)&insn2->field_0x18);
        if (iVar2 != 0) {
          bb2->call_p = '\x01';
        }
        goto LAB_00134feb;
      }
      if (use_insn != (MIR_insn_t)0x0) {
        if (use_insn != insn2) {
          __assert_fail("ret_insn == insn",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x63a,"void build_func_cfg(gen_ctx_t)");
        }
        goto LAB_00134feb;
      }
      if (func_00->global_vars == (VARR_MIR_var_t *)0x0) goto LAB_00134feb;
      VARR_MIR_op_ttrunc(gen_ctx->temp_ops,0);
      for (j = 0; sVar3 = VARR_MIR_var_tlength(func_00->global_vars), j < sVar3; j = j + 1) {
        VARR_MIR_var_tget(&local_198,func_00->global_vars,j);
        MVar1 = MIR_reg(ctx_00,local_198.name,func_00);
        mir_var.size._4_4_ = MVar1 + 0x21;
        varr = gen_ctx->temp_ops;
        _MIR_new_var_op((MIR_op_t *)&lref,ctx_00,mir_var.size._4_4_);
        obj._8_8_ = uStack_1c0;
        obj.data = lref;
        obj.u.i = aStack_1b8.i;
        obj.u.str.s = aStack_1b8.str.s;
        obj.u._16_8_ = aStack_1b8._16_8_;
        obj.u.mem.disp = aStack_1b8.mem.disp;
        VARR_MIR_op_tpush(varr,obj);
      }
      sVar3 = VARR_MIR_op_tlength(gen_ctx->temp_ops);
      ops = VARR_MIR_op_taddr(gen_ctx->temp_ops);
      ret_insn = MIR_new_insn_arr(ctx_00,MIR_USE,sVar3,ops);
      MIR_insert_insn_before(ctx_00,gen_ctx->curr_func_item,insn2,ret_insn);
      use_insn = insn2;
    }
    else {
      gen_ctx->addr_insn_p = 1;
      bitmap_set_bit_p(gen_ctx->addr_regs,(ulong)(*(int *)&insn2[1].insn_link.next + 0x21));
LAB_00134feb:
      if (insn2->data == (void *)0x0) {
        if (gen_ctx->optimize_level == 0) {
          setup_insn_data(gen_ctx,insn2,bb2);
        }
        else {
          add_new_bb_insn(gen_ctx,insn2,bb2,1);
        }
      }
      if ((int)*(undefined8 *)&insn2->field_0x18 == 0xa5) {
        if (((ulong)insn2[1].insn_link.prev & 0xff) != 0xc) {
          __assert_fail("insn->ops[1].mode == MIR_OP_LABEL",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x6f6,"void build_func_cfg(gen_ctx_t)");
        }
        VARR_MIR_insn_tpush(gen_ctx->temp_insns2,insn2[1].insn_link.next);
      }
      else if ((int)*(undefined8 *)&insn2->field_0x18 == 0xa6) {
        VARR_MIR_insn_tpush(gen_ctx->temp_insns,insn2);
      }
      sVar3 = MIR_insn_nops(ctx_00,insn2);
      if ((ret_insn != (MIR_insn_t)0x0) &&
         ((((iVar2 = MIR_any_branch_code_p((MIR_insn_code_t)*(undefined8 *)&insn2->field_0x18),
            iVar2 != 0 || ((int)*(undefined8 *)&insn2->field_0x18 == 0xab)) ||
           ((int)*(undefined8 *)&insn2->field_0x18 == 0xac)) ||
          ((((int)*(undefined8 *)&insn2->field_0x18 == 0xb7 ||
            ((int)*(undefined8 *)&insn2->field_0x18 == 0xb8)) ||
           ((int)*(undefined8 *)&ret_insn->field_0x18 == 0xb4)))))) {
        entry_bb = bb2;
        if (((int)*(undefined8 *)&ret_insn->field_0x18 == 0xb4) && (ret_insn->data != (void *)0x0))
        {
          bb2 = get_insn_bb(gen_ctx,ret_insn);
        }
        else {
          bb2 = create_bb(gen_ctx,ret_insn);
        }
        add_new_bb(gen_ctx,bb2);
        if (((((int)*(undefined8 *)&insn2->field_0x18 != 0x76) &&
             ((int)*(undefined8 *)&insn2->field_0x18 != 0xa6)) &&
            ((int)*(undefined8 *)&insn2->field_0x18 != 0xab)) &&
           (((int)*(undefined8 *)&insn2->field_0x18 != 0xac &&
            ((int)*(undefined8 *)&insn2->field_0x18 != 0xaa)))) {
          create_edge(gen_ctx,entry_bb,bb2,1,1);
        }
      }
      for (j = 0; j < sVar3; j = j + 1) {
        if ((*(ushort *)&insn2->ops[j].field_0x8 & 0xff) == 1) {
          *(ushort *)&insn2->ops[j].field_0x8 = *(ushort *)&insn2->ops[j].field_0x8 & 0xff00 | 2;
          if (insn2->ops[j].u.reg == 0) {
            local_224 = 0xffffffff;
          }
          else {
            local_224 = insn2->ops[j].u.reg + 0x21;
          }
          insn2->ops[j].u.reg = local_224;
        }
        else if ((*(ushort *)&insn2->ops[j].field_0x8 & 0xff) == 10) {
          *(ushort *)&insn2->ops[j].field_0x8 = *(ushort *)&insn2->ops[j].field_0x8 & 0xff00 | 0xb;
          if (insn2->ops[j].u.mem.base == 0) {
            local_228 = 0xffffffff;
          }
          else {
            local_228 = insn2->ops[j].u.mem.base + 0x21;
          }
          insn2->ops[j].u.mem.base = local_228;
          if (insn2->ops[j].u.mem.index == 0) {
            local_22c = 0xffffffff;
          }
          else {
            local_22c = insn2->ops[j].u.mem.index + 0x21;
          }
          insn2->ops[j].u.mem.index = local_22c;
        }
        if ((*(ushort *)&insn2->ops[j].field_0x8 & 0xff) == 0xc) {
          if ((insn2->ops[j].u.ref)->data == (void *)0x0) {
            create_bb(gen_ctx,(MIR_insn_t)insn2->ops[j].u.ref);
          }
          if ((int)*(undefined8 *)&insn2->field_0x18 != 0xa5) {
            local_168 = get_insn_bb(gen_ctx,(MIR_insn_t)insn2->ops[j].u.ref);
            src = get_insn_bb(gen_ctx,insn2);
            create_edge(gen_ctx,src,local_168,0,1);
          }
        }
        else if ((*(ushort *)&insn2->ops[j].field_0x8 & 0xff) == 2) {
          update_max_var(gen_ctx,insn2->ops[j].u.reg);
          update_tied_regs(gen_ctx,insn2->ops[j].u.reg);
        }
        else if ((*(ushort *)&insn2->ops[j].field_0x8 & 0xff) == 0xb) {
          update_max_var(gen_ctx,insn2->ops[j].u.mem.base);
          update_tied_regs(gen_ctx,insn2->ops[j].u.mem.base);
          update_max_var(gen_ctx,insn2->ops[j].u.mem.index);
          update_tied_regs(gen_ctx,insn2->ops[j].u.mem.index);
        }
      }
    }
    insn2 = ret_insn;
  } while( true );
}

Assistant:

static void build_func_cfg (gen_ctx_t gen_ctx) {
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_func_t func = curr_func_item->u.func;
  MIR_insn_t insn, insn2, next_insn, ret_insn, use_insn;
  MIR_insn_t new_insn MIR_UNUSED, new_label MIR_UNUSED, bo_insn MIR_UNUSED;
  size_t i, j, nops;
  MIR_op_t *op, temp_op1 MIR_UNUSED, temp_op2 MIR_UNUSED, temp_op3 MIR_UNUSED;
  MIR_reg_t reg;
  MIR_var_t mir_var;
  bb_t bb, bb2, prev_bb, entry_bb, exit_bb, label_bb;

  DLIST_INIT (bb_t, curr_cfg->bbs);
  curr_cfg->curr_bb_insn_index = 0;
  curr_cfg->max_var = MAX_HARD_REG;
  curr_cfg->root_loop_node = NULL;
  curr_bb_index = 0;
  for (i = 0; i < VARR_LENGTH (MIR_var_t, func->vars); i++) {
    mir_var = VARR_GET (MIR_var_t, func->vars, i);
    update_max_var (gen_ctx, MIR_reg (ctx, mir_var.name, func) + MAX_HARD_REG);
  }
  entry_bb = create_bb (gen_ctx, NULL);
  add_new_bb (gen_ctx, entry_bb);
  exit_bb = create_bb (gen_ctx, NULL);
  add_new_bb (gen_ctx, exit_bb);
  /* To deal with special cases like adding insns before call in
     machinize or moving invariant out of loop: */
  MIR_prepend_insn (ctx, curr_func_item, MIR_new_label (ctx));
  bb = create_bb (gen_ctx, NULL);
  add_new_bb (gen_ctx, bb);
  bitmap_clear (tied_regs);
  bitmap_clear (addr_regs);
  addr_insn_p = FALSE;
  VARR_TRUNC (MIR_insn_t, temp_insns, 0);
  VARR_TRUNC (MIR_insn_t, temp_insns2, 0);
  for (ret_insn = NULL, insn = DLIST_HEAD (MIR_insn_t, func->insns); insn != NULL;
       insn = next_insn) {
    next_insn = DLIST_NEXT (MIR_insn_t, insn);
    if (MIR_addr_code_p (insn->code)) {
      addr_insn_p = TRUE;
      bitmap_set_bit_p (addr_regs, insn->ops[1].u.reg + MAX_HARD_REG);
    } else if (insn->code == MIR_RET) {
      if (ret_insn != NULL) { /* we should have only one ret insn before generator */
        gen_assert (ret_insn == insn);
      } else if (func->global_vars != NULL) {
        VARR_TRUNC (MIR_op_t, temp_ops, 0);
        for (i = 0; i < VARR_LENGTH (MIR_var_t, func->global_vars); i++) {
          reg = MIR_reg (ctx, VARR_GET (MIR_var_t, func->global_vars, i).name, func) + MAX_HARD_REG;
          VARR_PUSH (MIR_op_t, temp_ops, _MIR_new_var_op (ctx, reg));
        }
        use_insn = MIR_new_insn_arr (ctx, MIR_USE, VARR_LENGTH (MIR_op_t, temp_ops),
                                     VARR_ADDR (MIR_op_t, temp_ops));
        MIR_insert_insn_before (ctx, curr_func_item, insn, use_insn);
        next_insn = use_insn;
        ret_insn = insn;
        continue;
      }
    } else if (MIR_call_code_p (insn->code)) {
      bb->call_p = TRUE;
    } else {
      switch (insn->code) { /* ??? should we copy result change before insn and bo */
#if defined(TARGET_EXPAND_ADDOS) || defined(TARGET_EXPAND_UADDOS)
      case MIR_ADDOS:
      case MIR_SUBOS: bo_insn = find_bo (gen_ctx, insn);
#ifndef TARGET_EXPAND_UADDOS
        if (bo_insn->code == MIR_UBO || bo_insn->code == MIR_UBNO) break;
#endif
#ifndef TARGET_EXPAND_ADDOS
        if (bo_insn->code == MIR_BO || bo_insn->code == MIR_BNO) break;
#endif
        insn->code = insn->code == MIR_ADDO ? MIR_ADDS : MIR_SUBS;
        new_temp_op (gen_ctx, &temp_op1);
        if (bo_insn->code == MIR_UBO || bo_insn->code == MIR_UBNO) {
          /* t1=a1;adds r,t1,a2; ublts r,t1,ov_label or t1=a1;subs r,t1,a2; ublts t1,res,ov_label */
          next_insn = new_insn = MIR_new_insn (ctx, MIR_MOV, temp_op1, insn->ops[1]);
          MIR_insert_insn_before (ctx, curr_func_item, insn, new_insn);
          insn->ops[1] = temp_op1;
          new_insn
            = MIR_new_insn (ctx, bo_insn->code == MIR_UBO ? MIR_UBLTS : MIR_UBGES, bo_insn->ops[0],
                            insn->code == MIR_ADDS ? insn->ops[0] : temp_op1,
                            insn->code == MIR_ADDS ? temp_op1 : insn->ops[0]);
          MIR_insert_insn_before (ctx, curr_func_item, bo_insn, new_insn);
        } else {
          /* ext32 t1,a1; ext32 t2,a2; (adds|subs) r,a1,a2; (add|sub) t1,t1,t2; ext32 t2,r;
             bne t1,t2,ov_lab */
          new_temp_op (gen_ctx, &temp_op2);
          next_insn = new_insn = MIR_new_insn (ctx, MIR_EXT32, temp_op1, insn->ops[1]);
          MIR_insert_insn_before (ctx, curr_func_item, insn, new_insn);
          new_insn = MIR_new_insn (ctx, MIR_EXT32, temp_op2, insn->ops[2]);
          MIR_insert_insn_before (ctx, curr_func_item, insn, new_insn);
          new_insn = MIR_new_insn (ctx, insn->code == MIR_ADDS ? MIR_ADD : MIR_SUB, temp_op1,
                                   temp_op1, temp_op2);
          MIR_insert_insn_before (ctx, curr_func_item, bo_insn, new_insn);
          new_insn = MIR_new_insn (ctx, MIR_EXT32, temp_op2, insn->ops[0]);
          MIR_insert_insn_before (ctx, curr_func_item, bo_insn, new_insn);
          new_insn = MIR_new_insn (ctx, bo_insn->code == MIR_BO ? MIR_BNE : MIR_BEQ,
                                   bo_insn->ops[0], temp_op1, temp_op2);
          MIR_insert_insn_before (ctx, curr_func_item, bo_insn, new_insn);
        }
        MIR_remove_insn (gen_ctx->ctx, curr_func_item, bo_insn);
        continue;
#endif
#if defined(TARGET_EXPAND_ADDO) || defined(TARGET_EXPAND_UADDO)
      case MIR_ADDO:
      case MIR_SUBO: bo_insn = find_bo (gen_ctx, insn);
#ifndef TARGET_EXPAND_UADDO
        if (bo_insn->code == MIR_UBO || bo_insn->code == MIR_UBNO) break;
#endif
#ifndef TARGET_EXPAND_ADDO
        if (bo_insn->code == MIR_BO || bo_insn->code == MIR_BNO) break;
#endif
        insn->code = insn->code == MIR_ADDO ? MIR_ADD : MIR_SUB;
        if (bo_insn->code == MIR_UBO || bo_insn->code == MIR_UBNO) {
          /* t1=a1;add r,t1,a2; ublt r,t1,ov_label or t1=a1;sub r,t1,a2; ublt t1,r,ov_lab */
          next_insn = new_insn = MIR_new_insn (ctx, MIR_MOV, temp_op1, insn->ops[1]);
          MIR_insert_insn_before (ctx, curr_func_item, insn, new_insn);
          insn->ops[1] = temp_op1;
          new_insn = MIR_new_insn (ctx, bo_insn->code == MIR_UBO ? MIR_UBLT : MIR_UBGE,
                                   bo_insn->ops[0], insn->code == MIR_ADD ? insn->ops[0] : temp_op1,
                                   insn->code == MIR_ADD ? temp_op1 : insn->ops[0]);
          MIR_insert_insn_before (ctx, curr_func_item, bo_insn, new_insn);
        } else {
          /* t1=a1;t2=a2;(add|sub) r,t1,t2;(lt t1,r,t1|lt t1,t1,r1);lt t2,t2,0;bne t2,t1,ov_lab */
          new_temp_op (gen_ctx, &temp_op1);
          new_temp_op (gen_ctx, &temp_op2);
          new_temp_op (gen_ctx, &temp_op3);
          next_insn = new_insn = MIR_new_insn (ctx, MIR_MOV, temp_op1, insn->ops[1]);
          MIR_insert_insn_before (ctx, curr_func_item, insn, new_insn);
          new_insn = MIR_new_insn (ctx, MIR_MOV, temp_op2, insn->ops[2]);
          MIR_insert_insn_before (ctx, curr_func_item, insn, new_insn);
          if (insn->code == MIR_ADDO)
            new_insn = MIR_new_insn (ctx, MIR_LT, temp_op1, insn->ops[0], temp_op1);
          else
            new_insn = MIR_new_insn (ctx, MIR_LT, temp_op1, temp_op1, insn->ops[0]);
          MIR_insert_insn_before (ctx, curr_func_item, bo_insn, new_insn);
          new_insn = MIR_new_insn (ctx, MIR_MOV, temp_op3, MIR_new_int_op (ctx, 0));
          MIR_insert_insn_before (ctx, curr_func_item, bo_insn, new_insn);
          new_insn = MIR_new_insn (ctx, MIR_LT, temp_op2, temp_op2, temp_op3);
          MIR_insert_insn_before (ctx, curr_func_item, bo_insn, new_insn);
          new_insn = MIR_new_insn (ctx, bo_insn->code == MIR_BO ? MIR_BNE : MIR_BEQ,
                                   bo_insn->ops[0], temp_op1, temp_op2);
          MIR_insert_insn_before (ctx, curr_func_item, bo_insn, new_insn);
        }
        MIR_remove_insn (gen_ctx->ctx, curr_func_item, bo_insn);
        continue;
#endif
#if defined(TARGET_EXPAND_MULOS) || defined(TARGET_EXPAND_UMULOS)
      case MIR_MULOS:
      case MIR_UMULOS:
        /* [u]ext32 t1,a1; [u]ext32 t2,a2;[u]mul t1,t1,t2; [u]ext32 r,t1;..; b(ne|eq) lab,t1,r */
        bo_insn = find_bo (gen_ctx, insn);
#ifndef TARGET_EXPAND_UMULOS
        if (bo_insn->code == MIR_UBO || bo_insn->code == MIR_UBNO) break;
#endif
#ifndef TARGET_EXPAND_MULOS
        if (bo_insn->code == MIR_BO || bo_insn->code == MIR_BNO) break;
#endif
        new_temp_op (gen_ctx, &temp_op1);
        new_temp_op (gen_ctx, &temp_op2);
        MIR_insn_code_t ext_code = insn->code == MIR_MULOS ? MIR_EXT32 : MIR_UEXT32;
        next_insn = new_insn = MIR_new_insn (ctx, ext_code, temp_op1, insn->ops[1]);
        MIR_insert_insn_before (ctx, curr_func_item, insn, new_insn);
        new_insn = MIR_new_insn (ctx, ext_code, temp_op2, insn->ops[2]);
        MIR_insert_insn_before (ctx, curr_func_item, insn, new_insn);
        new_insn = MIR_new_insn (ctx, ext_code, insn->ops[0], temp_op1);
        MIR_insert_insn_after (ctx, curr_func_item, insn, new_insn);
        insn->code = MIR_MUL;
        insn->ops[0] = temp_op1;
        insn->ops[1] = temp_op1;
        insn->ops[2] = temp_op2;
        new_insn
          = MIR_new_insn (ctx,
                          bo_insn->code == MIR_BO || bo_insn->code == MIR_UBO ? MIR_BNE : MIR_BEQ,
                          bo_insn->ops[0], new_insn->ops[0], new_insn->ops[1]);
        MIR_insert_insn_after (ctx, curr_func_item, bo_insn, new_insn);
        MIR_remove_insn (gen_ctx->ctx, curr_func_item, bo_insn);
        continue;
#endif
#if defined(TARGET_EXPAND_MULO) || defined(TARGET_EXPAND_UMULO)
      case MIR_MULO:
      case MIR_UMULO:
        /* t1=a1;t2=t2;mul r,t1,t2;...; [u]bno: bf lab,t1;[u]div t1,r,t1;bne lab,t,t2
           [u]bo: bf new_lab,t1;[u]div t1,r,t1;bne lab,t,t2;new_lab: */
        bo_insn = find_bo (gen_ctx, insn);
#ifndef TARGET_EXPAND_UMULO
        if (bo_insn->code == MIR_UBO || bo_insn->code == MIR_UBNO) break;
#endif
#ifndef TARGET_EXPAND_MULO
        if (bo_insn->code == MIR_BO || bo_insn->code == MIR_BNO) break;
#endif
        new_temp_op (gen_ctx, &temp_op1);
        new_temp_op (gen_ctx, &temp_op2);
        next_insn = new_insn = MIR_new_insn (ctx, MIR_MOV, temp_op1, insn->ops[1]);
        MIR_insert_insn_before (ctx, curr_func_item, insn, new_insn);
        new_insn = MIR_new_insn (ctx, MIR_MOV, temp_op2, insn->ops[2]);
        MIR_insert_insn_before (ctx, curr_func_item, insn, new_insn);
        insn->code = MIR_MUL;
        insn->ops[1] = temp_op1;
        insn->ops[2] = temp_op2;
        if (bo_insn->code == MIR_BNO || bo_insn->code == MIR_UBNO) {
          new_insn = MIR_new_insn (ctx, MIR_BF, bo_insn->ops[0], temp_op1);
        } else {
          new_label = MIR_new_label (ctx);
          new_insn = MIR_new_insn (ctx, MIR_BF, MIR_new_label_op (ctx, new_label), temp_op1);
        }
        MIR_insert_insn_before (ctx, curr_func_item, bo_insn, new_insn);
        new_insn
          = MIR_new_insn (ctx,
                          bo_insn->code == MIR_BO || bo_insn->code == MIR_BNO ? MIR_DIV : MIR_UDIV,
                          temp_op1, insn->ops[0], temp_op1);
        MIR_insert_insn_before (ctx, curr_func_item, bo_insn, new_insn);
        new_insn
          = MIR_new_insn (ctx,
                          bo_insn->code == MIR_BO || bo_insn->code == MIR_UBO ? MIR_BNE : MIR_BEQ,
                          bo_insn->ops[0], temp_op1, temp_op2);
        MIR_insert_insn_before (ctx, curr_func_item, bo_insn, new_insn);
        if (bo_insn->code == MIR_BO || bo_insn->code == MIR_UBO)
          MIR_insert_insn_before (ctx, curr_func_item, bo_insn, new_label);
        MIR_remove_insn (gen_ctx->ctx, curr_func_item, bo_insn);
        continue;
#endif
      default: break;
      }
    }
    if (insn->data == NULL) {
      if (optimize_level != 0)
        add_new_bb_insn (gen_ctx, insn, bb, TRUE);
      else
        setup_insn_data (gen_ctx, insn, bb);
    }
    if (insn->code == MIR_LADDR) {
      gen_assert (insn->ops[1].mode == MIR_OP_LABEL);
      VARR_PUSH (MIR_insn_t, temp_insns2, insn->ops[1].u.label);
    } else if (insn->code == MIR_JMPI) {
      VARR_PUSH (MIR_insn_t, temp_insns, insn);
    }
    nops = MIR_insn_nops (ctx, insn);
    if (next_insn != NULL
        && (MIR_any_branch_code_p (insn->code) || insn->code == MIR_RET || insn->code == MIR_JRET
            || insn->code == MIR_PRBEQ || insn->code == MIR_PRBNE
            || next_insn->code == MIR_LABEL)) {
      prev_bb = bb;
      if (next_insn->code == MIR_LABEL && next_insn->data != NULL)
        bb = get_insn_bb (gen_ctx, next_insn);
      else
        bb = create_bb (gen_ctx, next_insn);
      add_new_bb (gen_ctx, bb);
      if (insn->code != MIR_JMP && insn->code != MIR_JMPI && insn->code != MIR_RET
          && insn->code != MIR_JRET && insn->code != MIR_SWITCH)
        create_edge (gen_ctx, prev_bb, bb, TRUE, TRUE); /* fall through */
    }
    for (i = 0; i < nops; i++) { /* Transform all ops to var ops */
      op = &insn->ops[i];
      if (op->mode == MIR_OP_REG) {
        op->mode = MIR_OP_VAR;
        op->u.var = op->u.reg == 0 ? MIR_NON_VAR : op->u.reg + MAX_HARD_REG;
      } else if (op->mode == MIR_OP_MEM) {
        op->mode = MIR_OP_VAR_MEM;
        op->u.var_mem.base = op->u.mem.base == 0 ? MIR_NON_VAR : op->u.mem.base + MAX_HARD_REG;
        op->u.var_mem.index = op->u.mem.index == 0 ? MIR_NON_VAR : op->u.mem.index + MAX_HARD_REG;
      }
      if (op->mode == MIR_OP_LABEL) {
        if (op->u.label->data == NULL) create_bb (gen_ctx, op->u.label);
        if (insn->code != MIR_LADDR) {
          label_bb = get_insn_bb (gen_ctx, op->u.label);
          create_edge (gen_ctx, get_insn_bb (gen_ctx, insn), label_bb, FALSE, TRUE);
        }
      } else if (op->mode == MIR_OP_VAR) {
        update_max_var (gen_ctx, op->u.var);
        update_tied_regs (gen_ctx, op->u.var);
      } else if (op->mode == MIR_OP_VAR_MEM) {
        update_max_var (gen_ctx, op->u.var_mem.base);
        update_tied_regs (gen_ctx, op->u.var_mem.base);
        update_max_var (gen_ctx, op->u.var_mem.index);
        update_tied_regs (gen_ctx, op->u.var_mem.index);
      }
    }
  }
  for (MIR_lref_data_t lref = func->first_lref; lref != NULL; lref = lref->next) {
    VARR_PUSH (MIR_insn_t, temp_insns2, lref->label);
    if (lref->label2 != NULL) VARR_PUSH (MIR_insn_t, temp_insns2, lref->label2);
  }
  qsort (VARR_ADDR (MIR_insn_t, temp_insns2), VARR_LENGTH (MIR_insn_t, temp_insns2),
         sizeof (MIR_insn_t), label_cmp);
  for (i = 0; i < VARR_LENGTH (MIR_insn_t, temp_insns); i++) {
    insn = VARR_GET (MIR_insn_t, temp_insns, i);
    gen_assert (insn->code == MIR_JMPI);
    bb = get_insn_bb (gen_ctx, insn);
    MIR_insn_t prev_label = NULL;
    for (j = 0; j < VARR_LENGTH (MIR_insn_t, temp_insns2); j++) {
      insn2 = VARR_GET (MIR_insn_t, temp_insns2, j);
      if (insn2 == prev_label) continue;
      gen_assert (insn2->code == MIR_LABEL);
      prev_label = insn2;
      bb2 = get_insn_bb (gen_ctx, insn2);
      create_edge (gen_ctx, bb, bb2, FALSE, TRUE);
    }
  }
  for (i = 0; i < VARR_LENGTH (MIR_insn_t, temp_insns2); i++) {
    insn = VARR_GET (MIR_insn_t, temp_insns2, i);
    gen_assert (insn->code == MIR_LABEL);
    bb = get_insn_bb (gen_ctx, insn);
    bb->reachable_p = TRUE;
  }
  if (optimize_level > 0) remove_unreachable_bbs (gen_ctx);
  /* Add additional edges with entry and exit */
  for (bb = DLIST_HEAD (bb_t, curr_cfg->bbs); bb != NULL; bb = DLIST_NEXT (bb_t, bb)) {
    if (bb != entry_bb && DLIST_HEAD (in_edge_t, bb->in_edges) == NULL)
      create_edge (gen_ctx, entry_bb, bb, FALSE, TRUE);
    if (bb != exit_bb && DLIST_HEAD (out_edge_t, bb->out_edges) == NULL)
      create_edge (gen_ctx, bb, exit_bb, FALSE, TRUE);
  }
  enumerate_bbs (gen_ctx);
  VARR_CREATE (reg_info_t, curr_cfg->reg_info, 128);
  curr_cfg->call_crossed_regs = bitmap_create2 (curr_cfg->max_var);
}